

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

bool __thiscall
el::Configurations::hasConfiguration
          (Configurations *this,Level level,ConfigurationType configurationType)

{
  Configuration *pCVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  RegistryWithPred<el::Configuration,_el::Configuration::Predicate> *in_RDI;
  byte bVar2;
  ScopedLock scopedLock;
  NoMutex *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  ConfigurationType in_stack_ffffffffffffffec;
  
  (*(in_RDI->
    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
    ).super_ThreadSafe._vptr_ThreadSafe[2])();
  el::base::threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffb8
            );
  pCVar1 = el::base::utils::RegistryWithPred<el::Configuration,el::Configuration::Predicate>::
           get<el::Level,el::ConfigurationType>
                     (in_RDI,(Level *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffec);
  bVar2 = pCVar1 != (Configuration *)0x0;
  el::base::threading::internal::NoScopedLock<el::base::threading::internal::NoMutex>::~NoScopedLock
            ((NoScopedLock<el::base::threading::internal::NoMutex> *)&stack0xffffffffffffffe8);
  return (bool)(bVar2 & 1);
}

Assistant:

bool Configurations::hasConfiguration(Level level, ConfigurationType configurationType) {
  base::threading::ScopedLock scopedLock(lock());
#if ELPP_COMPILER_INTEL
  // We cant specify template types here, Intel C++ throws compilation error
  // "error: type name is not allowed"
  return RegistryWithPred::get(level, configurationType) != nullptr;
#else
  return RegistryWithPred<Configuration, Configuration::Predicate>::get(level, configurationType) != nullptr;
#endif  // ELPP_COMPILER_INTEL
}